

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesOverclockGetControlPendingValue
          (zes_overclock_handle_t hDomainHandle,zes_overclock_control_t DomainControl,double *pValue
          )

{
  zes_pfnOverclockGetControlPendingValue_t pfnGetControlPendingValue;
  ze_result_t result;
  double *pValue_local;
  zes_overclock_control_t DomainControl_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  pfnGetControlPendingValue._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb50 != (code *)0x0) {
    pfnGetControlPendingValue._4_4_ = (*DAT_0011cb50)(hDomainHandle,DomainControl,pValue);
  }
  return pfnGetControlPendingValue._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetControlPendingValue(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_control_t DomainControl,          ///< [in] Overclock Control.
        double* pValue                                  ///< [out] Returns the pending value for a given control. The units and
                                                        ///< format of the value depend on the control type.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetControlPendingValue = context.zesDdiTable.Overclock.pfnGetControlPendingValue;
        if( nullptr != pfnGetControlPendingValue )
        {
            result = pfnGetControlPendingValue( hDomainHandle, DomainControl, pValue );
        }
        else
        {
            // generic implementation
        }

        return result;
    }